

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int zenity3Present(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int local_418;
  int lIntTmp;
  FILE *lIn;
  char lBuff [1024];
  
  if (zenity3Present::lZenity3Present < 0) {
    zenity3Present::lZenity3Present = 0;
    iVar1 = zenityPresent();
    if (iVar1 != 0) {
      __stream = popen("zenity --version","r");
      pcVar2 = fgets((char *)&lIn,0x400,__stream);
      if (pcVar2 != (char *)0x0) {
        iVar1 = atoi((char *)&lIn);
        if (iVar1 < 3) {
          iVar1 = atoi((char *)&lIn);
          if (iVar1 == 2) {
            pcVar2 = strtok((char *)&lIn,".");
            iVar1 = atoi(pcVar2 + 2);
            if (0x1f < iVar1) {
              zenity3Present::lZenity3Present = 2;
            }
          }
        }
        else {
          zenity3Present::lZenity3Present = 3;
          pcVar2 = strtok((char *)&lIn,".");
          iVar1 = atoi(pcVar2 + 2);
          if (iVar1 < 0x12) {
            if (9 < iVar1) {
              zenity3Present::lZenity3Present = 4;
            }
          }
          else {
            zenity3Present::lZenity3Present = 5;
          }
        }
        if (tinyfd_verbose != 0) {
          printf("zenity %d\n",(ulong)(uint)zenity3Present::lZenity3Present);
        }
      }
      pclose(__stream);
    }
  }
  iVar1 = graphicMode();
  if (iVar1 == 0) {
    local_418 = 0;
  }
  else {
    local_418 = zenity3Present::lZenity3Present;
  }
  return local_418;
}

Assistant:

static int zenity3Present()
{
        static int lZenity3Present = -1 ;
        char lBuff [MAX_PATH_OR_CMD] ;
        FILE * lIn ;
		int lIntTmp ;

        if ( lZenity3Present < 0 )
        {
                lZenity3Present = 0 ;
                if ( zenityPresent() )
                {
                        lIn = popen( "zenity --version" , "r" ) ;
                        if ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                        {
                                if ( atoi(lBuff) >= 3 )
                                {
                                        lZenity3Present = 3 ;
										lIntTmp = atoi(strtok(lBuff,".")+2 ) ;
										if ( lIntTmp >= 18 )
										{
											lZenity3Present = 5 ;
										}
										else if ( lIntTmp >= 10 )
										{
											lZenity3Present = 4 ;
										}
								}
                                else if ( ( atoi(lBuff) == 2 ) && ( atoi(strtok(lBuff,".")+2 ) >= 32 ) )
                                {
                                        lZenity3Present = 2 ;
                                }
                                if (tinyfd_verbose) printf("zenity %d\n", lZenity3Present);
                        }
                        pclose( lIn ) ;
                }
        }
        return graphicMode() ? lZenity3Present : 0 ;
}